

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O3

void ** adt_ary_set(adt_ary_t *self,int32_t s32Index,void *pElem)

{
  int iVar1;
  
  if (self == (adt_ary_t *)0x0) {
    return (void **)0x0;
  }
  if (s32Index < 0) {
    iVar1 = self->s32CurLen;
    if (SBORROW4(iVar1,-s32Index) != iVar1 + s32Index < 0) {
      return (void **)0x0;
    }
    s32Index = iVar1 + s32Index;
  }
  adt_ary_fill(self,s32Index + 1);
  self->pFirst[s32Index] = pElem;
  return self->pFirst + s32Index;
}

Assistant:

void**	adt_ary_set(adt_ary_t *self, int32_t s32Index, void *pElem){
	if(self==0){
		return (void**)0;
	}
	if(s32Index<0){
		s32Index = (-s32Index);
		if(s32Index > (self->s32CurLen) ){
			//negative index outside array bounds
			return (void**) 0;
		}
		//negative index inside array bounds
		s32Index=self->s32CurLen-s32Index;
	}
	adt_ary_fill(self,((int32_t) s32Index)+1);
	self->pFirst[s32Index]=pElem;
	return &self->pFirst[s32Index];
}